

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O0

GLFWbool waitForAnyEvent(double *timeout)

{
  pollfd *ppVar1;
  pollfd pVar2;
  int iVar3;
  GLFWbool GVar4;
  pollfd *local_50;
  int local_44;
  int i;
  pollfd local_38;
  pollfd fds [3];
  nfds_t count;
  double *timeout_local;
  
  fds[2].fd = 2;
  fds[2].events = 0;
  fds[2].revents = 0;
  local_38.fd = *(int *)(_glfw.x11.display + 0x10);
  local_38.events = 1;
  local_38.revents = 0;
  fds[0].fd = _glfw.x11.emptyEventPipe[0];
  fds[0].events = 1;
  fds[0].revents = 0;
  local_50 = fds + 1;
  do {
    memset(local_50,0,8);
    local_50 = local_50 + 1;
  } while (local_50 != fds + 2);
  if (0 < _glfw.linjs.inotify) {
    pVar2.events = 1;
    pVar2.fd = _glfw.linjs.inotify;
    pVar2.revents = 0;
    ppVar1 = &local_38 + (long)fds[2];
    fds[2] = (pollfd)((long)fds[2] + 1);
    *ppVar1 = pVar2;
  }
  while( true ) {
    iVar3 = XPending(_glfw.x11.display);
    if (iVar3 != 0) {
      return 1;
    }
    GVar4 = waitForData(&local_38,(nfds_t)fds[2],timeout);
    if (GVar4 == 0) break;
    for (local_44 = 1; (ulong)(long)local_44 < (ulong)fds[2]; local_44 = local_44 + 1) {
      if ((fds[(long)local_44 + -1].revents & 1U) != 0) {
        return 1;
      }
    }
  }
  return 0;
}

Assistant:

static GLFWbool waitForAnyEvent(double* timeout)
{
    nfds_t count = 2;
    struct pollfd fds[3] =
    {
        { ConnectionNumber(_glfw.x11.display), POLLIN },
        { _glfw.x11.emptyEventPipe[0], POLLIN }
    };

#if defined(__linux__)
    if (_glfw.linjs.inotify > 0)
        fds[count++] = (struct pollfd) { _glfw.linjs.inotify, POLLIN };
#endif

    while (!XPending(_glfw.x11.display))
    {
        if (!waitForData(fds, count, timeout))
            return GLFW_FALSE;

        for (int i = 1; i < count; i++)
        {
            if (fds[i].revents & POLLIN)
                return GLFW_TRUE;
        }
    }

    return GLFW_TRUE;
}